

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

QNetworkInterface __thiscall
QNativeSocketEnginePrivate::nativeMulticastInterface(QNativeSocketEnginePrivate *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  qsizetype qVar4;
  long in_RSI;
  totally_ordered_wrapper<QNetworkInterfacePrivate_*> in_RDI;
  long in_FS_OFFSET;
  QNetworkAddressEntry *entry;
  int j;
  QNetworkInterface *iface;
  int i;
  QList<QNetworkAddressEntry> entries;
  QList<QNetworkInterface> ifaces;
  QHostAddress ipv4;
  socklen_t sizeofv;
  in_addr v;
  socklen_t sizeofv_1;
  uint v_1;
  QNetworkInterface *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  byte in_stack_ffffffffffffff47;
  QNetworkAddressEntry *in_stack_ffffffffffffff48;
  QHostAddress *in_stack_ffffffffffffff50;
  QSharedDataPointer<QNetworkInterfacePrivate> this_00;
  int local_7c;
  int local_6c;
  QList<QNetworkAddressEntry> local_50;
  QList<QNetworkInterface> local_38;
  undefined8 local_20;
  socklen_t local_18;
  uint32_t local_14;
  socklen_t local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(in_RSI + 0xa0) == 1) || (*(int *)(in_RSI + 0xa0) == 2)) {
    local_10[1] = 0xaaaaaaaa;
    local_10[0] = 4;
    iVar2 = getsockopt((int)*(undefined8 *)(in_RSI + 0xd8),0x29,0x11,local_10 + 1,local_10);
    if (iVar2 == -1) {
      QNetworkInterface::QNetworkInterface((QNetworkInterface *)0x35b0f6);
      this_00.d.ptr =
           (totally_ordered_wrapper<QNetworkInterfacePrivate_*>)
           (totally_ordered_wrapper<QNetworkInterfacePrivate_*>)in_RDI.ptr;
    }
    else {
      QNetworkInterface::interfaceFromIndex((int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      this_00.d.ptr =
           (totally_ordered_wrapper<QNetworkInterfacePrivate_*>)
           (totally_ordered_wrapper<QNetworkInterfacePrivate_*>)in_RDI.ptr;
    }
  }
  else {
    this_00.d.ptr =
         (totally_ordered_wrapper<QNetworkInterfacePrivate_*>)
         (totally_ordered_wrapper<QNetworkInterfacePrivate_*>)in_RDI.ptr;
    memset(&local_14,0,4);
    local_18 = 4;
    iVar2 = getsockopt((int)*(undefined8 *)(in_RSI + 0xd8),0,0x20,&local_14,&local_18);
    if (iVar2 == -1) {
      QNetworkInterface::QNetworkInterface((QNetworkInterface *)0x35b169);
    }
    else {
      if ((local_14 != 0) && (3 < local_18)) {
        local_20 = 0xaaaaaaaaaaaaaaaa;
        ntohl(local_14);
        QHostAddress::QHostAddress
                  (in_stack_ffffffffffffff50,(quint32)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_38.d.ptr = (QNetworkInterface *)0xaaaaaaaaaaaaaaaa;
        local_38.d.size = -0x5555555555555556;
        QNetworkInterface::allInterfaces();
        local_6c = 0;
        while( true ) {
          lVar3 = (long)local_6c;
          qVar4 = QList<QNetworkInterface>::size(&local_38);
          if (qVar4 <= lVar3) break;
          QList<QNetworkInterface>::at
                    ((QList<QNetworkInterface> *)
                     CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                     (qsizetype)in_stack_ffffffffffffff38);
          local_50.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_50.d.ptr = (QNetworkAddressEntry *)0xaaaaaaaaaaaaaaaa;
          local_50.d.size = -0x5555555555555556;
          QNetworkInterface::addressEntries((QNetworkInterface *)in_stack_ffffffffffffff48);
          local_7c = 0;
          while( true ) {
            in_stack_ffffffffffffff48 = (QNetworkAddressEntry *)(long)local_7c;
            qVar4 = QList<QNetworkAddressEntry>::size(&local_50);
            if (qVar4 <= (long)in_stack_ffffffffffffff48) break;
            QList<QNetworkAddressEntry>::at
                      ((QList<QNetworkAddressEntry> *)
                       CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                       (qsizetype)in_stack_ffffffffffffff38);
            QNetworkAddressEntry::ip(in_stack_ffffffffffffff48);
            in_stack_ffffffffffffff47 =
                 QHostAddress::operator==((QHostAddress *)this_00.d.ptr,(QHostAddress *)in_RDI.ptr);
            QHostAddress::~QHostAddress((QHostAddress *)0x35b2fc);
            if ((in_stack_ffffffffffffff47 & 1) != 0) {
              QNetworkInterface::QNetworkInterface
                        ((QNetworkInterface *)
                         CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              bVar1 = true;
              goto LAB_0035b339;
            }
            local_7c = local_7c + 1;
          }
          bVar1 = false;
LAB_0035b339:
          QList<QNetworkAddressEntry>::~QList((QList<QNetworkAddressEntry> *)0x35b343);
          if (bVar1) goto LAB_0035b367;
          local_6c = local_6c + 1;
        }
        bVar1 = false;
LAB_0035b367:
        QList<QNetworkInterface>::~QList((QList<QNetworkInterface> *)0x35b374);
        QHostAddress::~QHostAddress((QHostAddress *)0x35b381);
        if (bVar1) goto LAB_0035b399;
      }
      QNetworkInterface::QNetworkInterface((QNetworkInterface *)0x35b399);
    }
  }
LAB_0035b399:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QSharedDataPointer<QNetworkInterfacePrivate>)
         (QSharedDataPointer<QNetworkInterfacePrivate>)this_00.d.ptr;
}

Assistant:

QNetworkInterface QNativeSocketEnginePrivate::nativeMulticastInterface() const
{
    if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
        uint v;
        QT_SOCKOPTLEN_T sizeofv = sizeof(v);
        if (::getsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_MULTICAST_IF, &v, &sizeofv) == -1)
            return QNetworkInterface();
        return QNetworkInterface::interfaceFromIndex(v);
    }

#if defined(Q_OS_SOLARIS)
    struct in_addr v = { 0, 0, 0, 0};
#else
    struct in_addr v = { 0 };
#endif
    QT_SOCKOPTLEN_T sizeofv = sizeof(v);
    if (::getsockopt(socketDescriptor, IPPROTO_IP, IP_MULTICAST_IF, &v, &sizeofv) == -1)
        return QNetworkInterface();
    if (v.s_addr != 0 && sizeofv >= QT_SOCKOPTLEN_T(sizeof(v))) {
        QHostAddress ipv4(ntohl(v.s_addr));
        QList<QNetworkInterface> ifaces = QNetworkInterface::allInterfaces();
        for (int i = 0; i < ifaces.size(); ++i) {
            const QNetworkInterface &iface = ifaces.at(i);
            QList<QNetworkAddressEntry> entries = iface.addressEntries();
            for (int j = 0; j < entries.size(); ++j) {
                const QNetworkAddressEntry &entry = entries.at(j);
                if (entry.ip() == ipv4)
                    return iface;
            }
        }
    }
    return QNetworkInterface();
}